

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

ResourceArray * __thiscall
icu_63::ResourceDataValue::getArray
          (ResourceArray *__return_storage_ptr__,ResourceDataValue *this,UErrorCode *errorCode)

{
  uint *puVar1;
  ushort *puVar2;
  uint uVar3;
  uint *puVar4;
  ushort *puVar5;
  uint uVar6;
  
  if (U_ZERO_ERROR < *errorCode) {
LAB_002fb372:
    __return_storage_ptr__->items16 = (uint16_t *)0x0;
    __return_storage_ptr__->items32 = (uint32_t *)0x0;
    __return_storage_ptr__->length = 0;
    return __return_storage_ptr__;
  }
  uVar3 = this->res & 0xfffffff;
  uVar6 = this->res >> 0x1c;
  if (uVar6 == 9) {
    puVar2 = this->pResData->p16BitUnits + uVar3;
    puVar5 = puVar2 + 1;
    uVar3 = (uint)*puVar2;
    puVar4 = (uint *)0x0;
  }
  else {
    if (uVar6 != 8) {
      *errorCode = U_RESOURCE_TYPE_MISMATCH;
      goto LAB_002fb372;
    }
    if (uVar3 == 0) {
      puVar4 = (uint *)0x0;
      puVar5 = (ushort *)0x0;
      uVar3 = 0;
    }
    else {
      puVar1 = (uint *)(this->pResData->pRoot + uVar3);
      puVar4 = puVar1 + 1;
      uVar3 = *puVar1;
      puVar5 = (ushort *)0x0;
    }
  }
  __return_storage_ptr__->items16 = puVar5;
  __return_storage_ptr__->items32 = puVar4;
  __return_storage_ptr__->length = uVar3;
  return __return_storage_ptr__;
}

Assistant:

ResourceArray ResourceDataValue::getArray(UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return ResourceArray();
    }
    const uint16_t *items16 = NULL;
    const Resource *items32 = NULL;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length = 0;
    switch(RES_GET_TYPE(res)) {
    case URES_ARRAY:
        if (offset!=0) {  // empty if offset==0
            items32 = (const Resource *)pResData->pRoot+offset;
            length = *items32++;
        }
        break;
    case URES_ARRAY16:
        items16 = pResData->p16BitUnits+offset;
        length = *items16++;
        break;
    default:
        errorCode = U_RESOURCE_TYPE_MISMATCH;
        return ResourceArray();
    }
    return ResourceArray(items16, items32, length);
}